

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

void __thiscall
Clasp::WeightConstraint::reason(WeightConstraint *this,Solver *s,Literal p,LitVec *r)

{
  WL WVar1;
  uint uVar2;
  ulong in_RAX;
  uint uVar3;
  long lVar4;
  uint uVar5;
  undefined8 uStack_38;
  
  WVar1 = *this->lits_;
  if ((int)WVar1 < 0) {
    if ((s->assign_).reason_.data_.ebo_.size <= p.rep_ >> 2) {
      uVar5 = 0xffffffff;
      uVar3 = 1;
      goto LAB_0017a882;
    }
    uVar5 = (s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
  }
  else {
    uVar5 = *(uint *)&this->field_0x10 & 0x7ffffff;
  }
  uVar3 = (uint)WVar1 >> 0x1f;
  if (uVar3 == uVar5) {
    return;
  }
LAB_0017a882:
  lVar4 = 0;
  uStack_38 = in_RAX;
  do {
    uVar2 = (uint)this->bound_[(ulong)((uint)WVar1 >> 0x1f) + lVar4 + 2] >> 1 & 1;
    if (uVar2 == (*(uint *)&this->field_0x10 >> 0x1c & 3)) {
      uStack_38 = CONCAT44((uint)this->lits_
                                 [(ulong)(((uint)this->bound_
                                                 [(ulong)((uint)WVar1 >> 0x1f) + lVar4 + 2] >> 2) <<
                                         (SUB41(*this->lits_,3) >> 7)) + 1] & 0xfffffffe ^ uVar2 * 2
                           ,(undefined4)uStack_38) ^ 0x200000000;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (r,(Literal *)((long)&uStack_38 + 4));
    }
    lVar4 = lVar4 + 1;
  } while (uVar5 - uVar3 != (int)lVar4);
  return;
}

Assistant:

void WeightConstraint::reason(Solver& s, Literal p, LitVec& r) {
	assert(active_ != NOT_ACTIVE);
	Literal x;
	uint32 stop = !isWeight() ? up_ : s.reasonData(p);
	assert(stop <= up_);
	for (uint32 i = undoStart(); i != stop; ++i) {
		UndoInfo u = undo_[i];
		// Consider only lits that are relevant to the active constraint
		if (u.constraint() == (ActiveConstraint)active_) {
			x = lit(u.idx(), u.constraint());
			r.push_back( ~x );
		}
	}
}